

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server2.cpp
# Opt level: O1

void threadFunc(int id,int new_fd,bool *finished,bool *msgFlags,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *msgs,vector<cUser,_std::allocator<cUser>_> *currUsers)

{
  string *psVar1;
  pointer pcVar2;
  anon_struct_40_2_6a8bb0e8 *paVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  ssize_t sVar8;
  undefined8 uVar9;
  string *psVar10;
  ostream *poVar11;
  __normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_> _Var12;
  _Alloc_hider _Var13;
  __normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_> __position;
  long lVar14;
  pointer paVar15;
  string *unaff_R14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  char cVar17;
  bool bVar18;
  string local_198;
  string local_178;
  string local_158;
  undefined1 *local_138;
  long local_130;
  undefined1 local_128 [16];
  size_type *local_118;
  pointer local_110;
  size_type local_108;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  pollfd local_f8;
  pollfd pollData [1];
  size_type *local_e0;
  pointer local_d8;
  undefined8 local_d0;
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [8];
  string currUser;
  long local_98;
  undefined1 local_90 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_80;
  bool *local_78;
  vector<cUser,_std::allocator<cUser>_> *local_70;
  int local_64;
  pointer local_60;
  size_type *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  
  local_c0 = (undefined1  [8])&currUser._M_string_length;
  currUser._M_dataplus._M_p = (pointer)0x0;
  currUser._M_string_length._0_1_ = 0;
  local_f8.events = 1;
  pollData[0].fd = 0;
  pollData[0].events = 0;
  pollData[0].revents = 0;
  local_f8.fd = new_fd;
  local_80 = msgs;
  local_78 = msgFlags;
  local_70 = currUsers;
  local_64 = id;
  bVar18 = false;
joined_r0x00104ce4:
  do {
    bVar5 = bVar18;
    if (!bVar5) {
      sVar8 = send(new_fd,"Use Command Login To Login:",0x1c,0);
      if (sVar8 == -1) {
        perror("send");
      }
      unaff_R14 = getCommand_abi_cxx11_(new_fd,&local_f8,local_78,local_64);
      if (unaff_R14 != (string *)0x0) {
        local_58 = &__str._M_string_length;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"login","");
        pcVar2 = (pointer)unaff_R14->_M_string_length;
        if (pcVar2 == __str._M_dataplus._M_p) {
          if (pcVar2 == (pointer)0x0) {
            bVar18 = true;
          }
          else {
            iVar7 = bcmp((unaff_R14->_M_dataplus)._M_p,local_58,(size_t)pcVar2);
            bVar18 = iVar7 == 0;
          }
        }
        else {
          bVar18 = false;
        }
        if (bVar18) {
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          pcVar2 = unaff_R14[1]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_198,pcVar2,pcVar2 + unaff_R14[1]._M_string_length);
          iVar7 = login(&local_198,new_fd,(string *)local_c0,local_70,local_64,local_78,local_80);
          cVar17 = (char)iVar7;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p);
          }
        }
        else {
          cVar17 = '\0';
        }
        if (local_58 != &__str._M_string_length) {
          operator_delete(local_58);
        }
        bVar18 = true;
        if (cVar17 == '\0') {
          send(new_fd,"Server: Denied. Please login first.",0x28,0);
          bVar18 = bVar5;
        }
        goto joined_r0x00104ce4;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"connection with host lost",0x19);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
      std::ostream::put('h');
      uVar9 = std::ostream::flush();
      pollData[0]._1_7_ = (undefined7)((ulong)uVar9 >> 8);
      pollData[0].fd._0_1_ = 1;
      unaff_R14 = (string *)0x0;
    }
    if (((ulong)pollData[0] & 1) != 0) {
      if (unaff_R14 == (string *)0x0) goto LAB_00105789;
      lVar14 = *(long *)((long)&unaff_R14[-1].field_2 + 8);
      if (lVar14 != 0) {
        paVar16 = &unaff_R14[lVar14 + -1].field_2;
        lVar14 = lVar14 * -0x20;
        do {
          pcVar2 = (((string *)(paVar16 + -1))->_M_dataplus)._M_p;
          if (paVar16 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar2) {
            operator_delete(pcVar2);
          }
          paVar16 = paVar16 + -2;
          lVar14 = lVar14 + 0x20;
        } while (lVar14 != 0);
      }
      goto LAB_00105781;
    }
    bVar18 = bVar5;
    if (bVar5) {
      psVar10 = getCommand_abi_cxx11_(new_fd,&local_f8,local_78,local_64);
      if (psVar10 == (string *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Client connection lost",0x16);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
        std::ostream::put('h');
        std::ostream::flush();
        bVar4 = false;
      }
      else {
        local_58 = &__str._M_string_length;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"newuser","");
        pcVar2 = (pointer)psVar10->_M_string_length;
        if (pcVar2 == __str._M_dataplus._M_p) {
          if (pcVar2 == (pointer)0x0) {
            bVar18 = true;
          }
          else {
            iVar7 = bcmp((psVar10->_M_dataplus)._M_p,local_58,(size_t)pcVar2);
            bVar18 = iVar7 == 0;
          }
        }
        else {
          bVar18 = false;
        }
        if (local_58 != &__str._M_string_length) {
          operator_delete(local_58);
        }
        if (bVar18) {
          local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
          pcVar2 = psVar10[1]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_178,pcVar2,pcVar2 + psVar10[1]._M_string_length);
          newUser(&local_178,new_fd);
          psVar10 = &local_178;
          _Var13._M_p = local_178._M_dataplus._M_p;
LAB_00104fc3:
          bVar4 = true;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var13._M_p != &psVar10->field_2) {
            operator_delete(_Var13._M_p);
          }
        }
        else {
          local_58 = &__str._M_string_length;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"msg","");
          pcVar2 = (pointer)psVar10->_M_string_length;
          if (pcVar2 == __str._M_dataplus._M_p) {
            if (pcVar2 == (pointer)0x0) {
              bVar18 = true;
            }
            else {
              iVar7 = bcmp((psVar10->_M_dataplus)._M_p,local_58,(size_t)pcVar2);
              bVar18 = iVar7 == 0;
            }
          }
          else {
            bVar18 = false;
          }
          if (local_58 != &__str._M_string_length) {
            operator_delete(local_58);
          }
          if (bVar18) {
            sVar8 = send(new_fd,(local_80->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[id]._M_dataplus._M_p,0xff
                         ,0);
            if (sVar8 == -1) {
              perror("send error");
            }
            local_78[id] = false;
            bVar4 = true;
          }
          else {
            local_58 = &__str._M_string_length;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"who","");
            pcVar2 = (pointer)psVar10->_M_string_length;
            if (pcVar2 == __str._M_dataplus._M_p) {
              if (pcVar2 == (pointer)0x0) {
                bVar18 = true;
              }
              else {
                iVar7 = bcmp((psVar10->_M_dataplus)._M_p,local_58,(size_t)pcVar2);
                bVar18 = iVar7 == 0;
              }
            }
            else {
              bVar18 = false;
            }
            if (local_58 != &__str._M_string_length) {
              operator_delete(local_58);
            }
            if (bVar18) {
              bVar4 = true;
              who(local_70,new_fd);
            }
            else {
              local_58 = &__str._M_string_length;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"send","");
              pcVar2 = (pointer)psVar10->_M_string_length;
              if (pcVar2 == __str._M_dataplus._M_p) {
                if (pcVar2 == (pointer)0x0) {
                  bVar18 = true;
                }
                else {
                  iVar7 = bcmp((psVar10->_M_dataplus)._M_p,local_58,(size_t)pcVar2);
                  bVar18 = iVar7 == 0;
                }
              }
              else {
                bVar18 = false;
              }
              if (local_58 != &__str._M_string_length) {
                operator_delete(local_58);
              }
              if (bVar18) {
                local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
                pcVar2 = psVar10[1]._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_158,pcVar2,pcVar2 + psVar10[1]._M_string_length);
                sendMessage(&local_158,new_fd,(string *)local_c0,local_70,local_78,local_80);
                psVar10 = &local_158;
                _Var13._M_p = local_158._M_dataplus._M_p;
                goto LAB_00104fc3;
              }
              local_58 = &__str._M_string_length;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"logout","");
              pcVar2 = (pointer)psVar10->_M_string_length;
              if (pcVar2 == __str._M_dataplus._M_p) {
                if (pcVar2 == (pointer)0x0) {
                  bVar18 = true;
                }
                else {
                  iVar7 = bcmp((psVar10->_M_dataplus)._M_p,local_58,(size_t)pcVar2);
                  bVar18 = iVar7 == 0;
                }
              }
              else {
                bVar18 = false;
              }
              if (local_58 != &__str._M_string_length) {
                operator_delete(local_58);
              }
              if (!bVar18) {
                sVar8 = send(new_fd,"Invalid Command",0x14,0);
                bVar4 = true;
                if (sVar8 == -1) {
                  perror("send");
                }
                goto LAB_001050e8;
              }
              sVar8 = send(new_fd,"You are now loged out",0x19,0);
              if (sVar8 == -1) {
                perror("send");
              }
              local_58 = &__str._M_string_length;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_58,local_c0,currUser._M_dataplus._M_p + (long)local_c0);
              std::__cxx11::string::append((char *)&local_58);
              poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,(char *)local_58,
                                   (long)__str._M_dataplus._M_p);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
              std::ostream::put((char)poVar11);
              std::ostream::flush();
              if (local_58 != &__str._M_string_length) {
                operator_delete(local_58);
              }
              _Var12._M_current =
                   (local_70->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
                   super__Vector_impl_data._M_start;
              paVar3 = (local_70->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
              local_138 = local_128;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_138,local_c0,currUser._M_dataplus._M_p + (long)local_c0);
              local_e0 = &local_d0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_e0,local_138,local_138 + local_130);
              uVar6 = (uint)local_d0;
              local_110 = local_d8;
              if (local_e0 == &local_d0) {
                __str.field_2._M_allocated_capacity._0_4_ = uStack_c8;
                __str.field_2._M_allocated_capacity._4_4_ = uStack_c4;
                local_58 = &__str._M_string_length;
              }
              else {
                local_58 = local_e0;
              }
              __str._M_string_length = CONCAT44(local_d0._4_4_,(uint)local_d0);
              __str._M_dataplus._M_p = local_d8;
              local_d8 = (pointer)0x0;
              local_d0._0_4_ = (uint)local_d0 & 0xffffff00;
              local_118 = &local_108;
              if (local_58 == &__str._M_string_length) {
                local_108 = CONCAT44(local_d0._4_4_,uVar6);
                uStack_100 = __str.field_2._M_allocated_capacity._0_4_;
                uStack_fc = __str.field_2._M_allocated_capacity._4_4_;
              }
              else {
                local_118 = local_58;
                local_108 = __str._M_string_length;
              }
              currUser.field_2._8_8_ = local_90;
              local_e0 = &local_d0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)((long)&currUser.field_2 + 8),local_118,
                         local_110 + (long)local_118);
              local_58 = &__str._M_string_length;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_58,currUser.field_2._8_8_,
                         local_98 + currUser.field_2._8_8_);
              lVar14 = ((long)paVar3 - (long)_Var12._M_current >> 3) * -0x3333333333333333 >> 2;
              local_60 = paVar3;
              if (0 < lVar14) {
                lVar14 = lVar14 + 1;
                do {
                  bVar18 = __gnu_cxx::__ops::
                           _Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::$_0>
                           ::operator()((_Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::__0>
                                         *)&local_58,_Var12);
                  paVar15 = local_60;
                  __position._M_current = _Var12._M_current;
                  if (bVar18) goto LAB_0010554a;
                  bVar18 = __gnu_cxx::__ops::
                           _Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::$_0>
                           ::operator()((_Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::__0>
                                         *)&local_58,_Var12._M_current + 1);
                  paVar15 = local_60;
                  __position._M_current = _Var12._M_current + 1;
                  if (bVar18) goto LAB_0010554a;
                  bVar18 = __gnu_cxx::__ops::
                           _Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::$_0>
                           ::operator()((_Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::__0>
                                         *)&local_58,_Var12._M_current + 2);
                  paVar15 = local_60;
                  __position._M_current = _Var12._M_current + 2;
                  if (bVar18) goto LAB_0010554a;
                  bVar18 = __gnu_cxx::__ops::
                           _Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::$_0>
                           ::operator()((_Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::__0>
                                         *)&local_58,_Var12._M_current + 3);
                  paVar15 = local_60;
                  __position._M_current = _Var12._M_current + 3;
                  if (bVar18) goto LAB_0010554a;
                  _Var12._M_current = _Var12._M_current + 4;
                  lVar14 = lVar14 + -1;
                } while (1 < lVar14);
              }
              paVar15 = local_60;
              lVar14 = ((long)local_60 - (long)_Var12._M_current >> 3) * -0x3333333333333333;
              if (lVar14 == 1) {
LAB_0010552a:
                bVar18 = __gnu_cxx::__ops::
                         _Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::$_0>
                         ::operator()((_Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::__0>
                                       *)&local_58,_Var12);
                __position._M_current = _Var12._M_current;
                if (!bVar18) {
                  __position._M_current = paVar15;
                }
              }
              else if (lVar14 == 2) {
LAB_00105513:
                bVar18 = __gnu_cxx::__ops::
                         _Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::$_0>
                         ::operator()((_Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::__0>
                                       *)&local_58,_Var12);
                __position._M_current = _Var12._M_current;
                if (!bVar18) {
                  _Var12._M_current = _Var12._M_current + 1;
                  goto LAB_0010552a;
                }
              }
              else {
                __position._M_current = paVar15;
                if ((lVar14 == 3) &&
                   (bVar18 = __gnu_cxx::__ops::
                             _Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::$_0>
                             ::operator()((_Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::__0>
                                           *)&local_58,_Var12),
                   __position._M_current = _Var12._M_current, !bVar18)) {
                  _Var12._M_current = _Var12._M_current + 1;
                  goto LAB_00105513;
                }
              }
LAB_0010554a:
              if (local_58 != &__str._M_string_length) {
                operator_delete(local_58);
              }
              if ((undefined1 *)currUser.field_2._8_8_ != local_90) {
                operator_delete((void *)currUser.field_2._8_8_);
              }
              _Var12._M_current = __position._M_current + 1;
              if (_Var12._M_current != paVar15 && __position._M_current != paVar15) {
                do {
                  bVar18 = __gnu_cxx::__ops::
                           _Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::$_0>
                           ::operator()((_Iter_pred<threadFunc(int,int,bool*,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<cUser,std::allocator<cUser>>&)::__0>
                                         *)&local_118,_Var12);
                  if (!bVar18) {
                    std::__cxx11::string::operator=
                              ((string *)__position._M_current,(string *)_Var12._M_current);
                    (__position._M_current)->id = (_Var12._M_current)->id;
                    __position._M_current = __position._M_current + 1;
                  }
                  _Var12._M_current = _Var12._M_current + 1;
                } while (_Var12._M_current != paVar15);
              }
              if (local_118 != &local_108) {
                operator_delete(local_118);
              }
              if (local_e0 != &local_d0) {
                operator_delete(local_e0);
              }
              std::vector<cUser,_std::allocator<cUser>_>::_M_erase
                        (local_70,(iterator)__position._M_current);
              if (local_138 != local_128) {
                operator_delete(local_138);
              }
              paVar15 = (local_70->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              local_60 = (local_70->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
                         super__Vector_impl_data._M_finish;
              if (paVar15 == local_60) {
                bVar4 = false;
                bVar5 = false;
              }
              else {
                do {
                  local_58 = &__str._M_string_length;
                  pcVar2 = (paVar15->username)._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_58,pcVar2,
                             pcVar2 + (paVar15->username)._M_string_length);
                  __str.field_2._8_4_ = paVar15->id;
                  currUser.field_2._8_8_ = local_90;
                  psVar1 = (string *)(currUser.field_2._M_local_buf + 8);
                  std::__cxx11::string::_M_construct<char*>
                            (psVar1,local_c0,currUser._M_dataplus._M_p + (long)local_c0);
                  std::__cxx11::string::append((char *)psVar1);
                  std::__cxx11::string::operator=
                            ((string *)
                             ((local_80->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + (int)__str.field_2._8_4_)
                             ,psVar1);
                  if ((undefined1 *)currUser.field_2._8_8_ != local_90) {
                    operator_delete((void *)currUser.field_2._8_8_);
                  }
                  local_78[(int)__str.field_2._8_4_] = true;
                  if (local_58 != &__str._M_string_length) {
                    operator_delete(local_58);
                  }
                  paVar15 = paVar15 + 1;
                  bVar4 = false;
                  bVar5 = false;
                } while (paVar15 != local_60);
              }
            }
          }
        }
      }
LAB_001050e8:
      bVar18 = bVar5;
      if (!bVar4) {
        if (unaff_R14 != (string *)0x0) {
          lVar14 = *(long *)((long)&unaff_R14[-1].field_2 + 8);
          if (lVar14 != 0) {
            paVar16 = &unaff_R14[lVar14 + -1].field_2;
            lVar14 = lVar14 * -0x20;
            do {
              pcVar2 = (((string *)(paVar16 + -1))->_M_dataplus)._M_p;
              if (paVar16 !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pcVar2) {
                operator_delete(pcVar2);
              }
              paVar16 = paVar16 + -2;
              lVar14 = lVar14 + 0x20;
            } while (lVar14 != 0);
          }
LAB_00105781:
          operator_delete__((void *)((long)&unaff_R14[-1].field_2 + 8));
        }
LAB_00105789:
        close(new_fd);
        if (local_c0 != (undefined1  [8])&currUser._M_string_length) {
          operator_delete((void *)local_c0);
        }
        return;
      }
    }
  } while( true );
}

Assistant:

void threadFunc(int id,int new_fd, bool* finished,
    bool* msgFlags, vector<string>& msgs, vector<cUser>& currUsers){

    //needed flags for user flow
    bool loginFlag = false;
    bool connectionLost = false;
    char buffer[MAXDATASIZE];
    string* cmd;
    string currUser;
    struct pollfd pollData[1];

    //set up the polling data for the sockets function
    pollData[0].fd = new_fd;
    pollData[0].events = POLLIN;


    while(1){
        //don't let anyone past unless they got that login
        while(!loginFlag){

            //Send login notice
            if (send(new_fd, "Use Command Login To Login:", 28, 0) == -1)
                perror("send");

            //get the users command
            cmd = getCommand(new_fd,pollData,msgFlags,id);

            //if the getCommand function returns null it means connection was lost
            if(cmd == NULL){
                cout << "connection with host lost" << endl;
                connectionLost = true;
                break;
            }

            //if they are all logged in set it all up
            if(cmd[0] == string("login") && login(cmd[1],new_fd,&currUser,currUsers,id, msgFlags, msgs)){
                //add the user to the current users list
                loginFlag = true;
            }
            else{
                send(new_fd, "Server: Denied. Please login first.", 40, 0);
            }
        }

        //make sure connection isn't lost during logins
        if(connectionLost){
            delete[] cmd;
            close(new_fd);
            return;
        }
        //start looping through recieving and sending messages
        if(loginFlag){
            string* cmd = getCommand(new_fd,pollData,msgFlags,id);

            //connection to the socket was lost
            if(cmd == NULL){
                cout << "Client connection lost" << endl;
                break;
            }


            //user flow to activate functions for each command
            if(cmd[0] == string("newuser")){
                newUser(cmd[1],new_fd);
            }
            else if(cmd[0] == string("msg")){
                if(send(new_fd,msgs[id].c_str(),MAXDATASIZE-1,0) == -1)
                    perror("send error");
                msgFlags[id] = false;
            }
            else if (cmd[0] == string("who")){
                who(currUsers,new_fd);
            }
            else if (cmd[0] == string("send")){
                sendMessage(cmd[1], new_fd, currUser, currUsers, msgFlags, msgs);
            }
            else if (cmd[0] == string("logout")){
                if (send(new_fd, "You are now loged out", 25, 0) == -1)
                    perror("send");

                loginFlag = false;

                cout << currUser + " logout." << endl;

                //remove the user from the list of current users
                currUsers.erase(remove_if(currUsers.begin(), currUsers.end(),[currUser](cUser u){
                    return (u.username == currUser);
                }));

                //broadcast the user has joined
                for(cUser user : currUsers){
                    msgs[user.id] = string(currUser + " left");
                    msgFlags[user.id] = true;
                }

                break;

            }
            //catch any other invalid input
            else {
                if(send((new_fd),"Invalid Command",20,0) == -1)
                    perror("send");
            }
        }
    }
    //final clean up
    delete[] cmd;
    close(new_fd);
}